

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::printHeaderString(ConsoleReporter *this,string *_string,size_t indent)

{
  ulong uVar1;
  Column *this_00;
  ostream *poVar2;
  size_t in_RDX;
  char *in_RSI;
  Column *in_stack_00000018;
  ostream *in_stack_00000020;
  size_t idx;
  string *in_stack_ffffffffffffff58;
  Column *in_stack_ffffffffffffff60;
  Column local_60;
  long local_20;
  size_t local_18;
  
  local_18 = in_RDX;
  uVar1 = std::__cxx11::string::find(in_RSI,0x233700);
  if ((uVar1 == 0xffffffffffffffff) || (0x13 < uVar1)) {
    local_20 = 0;
  }
  else {
    local_20 = uVar1 + 2;
  }
  TextFlow::Column::Column(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  this_00 = TextFlow::Column::indent(&local_60,local_18 + local_20);
  TextFlow::Column::initialIndent(this_00,local_18);
  poVar2 = TextFlow::operator<<(in_stack_00000020,in_stack_00000018);
  std::operator<<(poVar2,'\n');
  TextFlow::Column::~Column((Column *)0x1a1837);
  return;
}

Assistant:

void ConsoleReporter::printHeaderString(std::string const& _string, std::size_t indent) {
    // We want to get a bit fancy with line breaking here, so that subsequent
    // lines start after ":" if one is present, e.g.
    // ```
    // blablabla: Fancy
    //            linebreaking
    // ```
    // but we also want to avoid problems with overly long indentation causing
    // the text to take up too many lines, e.g.
    // ```
    // blablabla: F
    //            a
    //            n
    //            c
    //            y
    //            .
    //            .
    //            .
    // ```
    // So we limit the prefix indentation check to first quarter of the possible
    // width
    std::size_t idx = _string.find( ": " );
    if ( idx != std::string::npos && idx < CATCH_CONFIG_CONSOLE_WIDTH / 4 ) {
        idx += 2;
    } else {
        idx = 0;
    }
    m_stream << TextFlow::Column( _string )
                  .indent( indent + idx )
                  .initialIndent( indent )
           << '\n';
}